

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O3

void __thiscall
TrodesMsg::TrodesMsg<char_const*,std::__cxx11::string,unsigned_int>
          (TrodesMsg *this,string *f,char *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,uint tail_1)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  TrodesMsg(this);
  pcVar1 = (f->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + f->_M_string_length)
  ;
  pcVar1 = (tail->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + tail->_M_string_length);
  addcontents<char_const*,std::__cxx11::string,unsigned_int>(this,&local_50,head,&local_70,tail_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TrodesMsg(std::string f, H head, T... tail) : TrodesMsg(){
        addcontents(f, head, tail...);
    }